

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

short __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,short,duckdb::QuantileComposed<duckdb::MadAccessor<short,short,short>,duckdb::QuantileIndirect<short>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
          *accessor)

{
  idx_t iVar1;
  long lVar2;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>_>_>
  __comp_01;
  bool bVar3;
  RESULT_TYPE RVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  int iVar9;
  unkbyte10 Var10;
  short result_1;
  short local_52;
  string local_50;
  
  bVar3 = this->desc;
  iVar7 = this->CRN;
  iVar8 = this->FRN;
  iVar1 = this->begin;
  iVar6 = this->end;
  local_50._M_dataplus._M_p = (pointer)accessor;
  local_50._M_string_length = (size_type)accessor;
  local_50.field_2._M_local_buf[0] = bVar3;
  if (iVar7 == iVar8) {
    if (iVar7 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)(iVar6 * 8 + iVar1 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar3;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<short,short,short>,duckdb::QuantileIndirect<short>>>>>
                (v_t + iVar1,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar7 = this->FRN;
    }
    RVar4 = QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
            ::operator()(accessor,v_t + iVar7);
    bVar3 = TryCast::Operation<short,short>(RVar4,&local_52,false);
    if (!bVar3) {
      Var10 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_50,(duckdb *)(ulong)(uint)(int)RVar4,(short)((unkuint10)Var10 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var10,&local_50);
      __cxa_throw((InvalidInputException *)Var10,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar8 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)(iVar6 * 8 + iVar1 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar3;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<short,short,short>,duckdb::QuantileIndirect<short>>>>>
                (v_t + iVar1,v_t + iVar8,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar8 = this->FRN;
      iVar7 = this->CRN;
      iVar6 = this->end;
    }
    local_50._M_dataplus._M_p = (pointer)accessor;
    local_50._M_string_length = (size_type)accessor;
    local_50.field_2._M_local_buf[0] = bVar3;
    if (iVar7 != iVar6 && iVar8 != iVar6) {
      uVar5 = (long)(iVar6 * 8 + iVar8 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar3;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<short,short,short>,duckdb::QuantileIndirect<short>>>>>
                (v_t + iVar8,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar8 = this->FRN;
    }
    RVar4 = QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
            ::operator()(accessor,v_t + iVar8);
    bVar3 = TryCast::Operation<short,short>(RVar4,&local_52,false);
    if (!bVar3) {
      Var10 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_50,(duckdb *)(ulong)(uint)(int)RVar4,(short)((unkuint10)Var10 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var10,&local_50);
      __cxa_throw((InvalidInputException *)Var10,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    iVar9 = (int)local_52;
    RVar4 = QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
            ::operator()(accessor,v_t + this->CRN);
    bVar3 = TryCast::Operation<short,short>(RVar4,&local_52,false);
    if (!bVar3) {
      Var10 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_50,(duckdb *)(ulong)(uint)(int)RVar4,(short)((unkuint10)Var10 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var10,&local_50);
      __cxa_throw((InvalidInputException *)Var10,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    local_52 = (short)(int)((double)(local_52 - iVar9) *
                            (this->RN -
                            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                           (double)iVar9);
  }
  return local_52;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}